

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O0

void __thiscall warning_suppressor::warning_suppressor(warning_suppressor *this)

{
  streambuf *psVar1;
  ostringstream *in_RDI;
  
  std::__cxx11::ostringstream::ostringstream(in_RDI);
  std::__cxx11::ostringstream::rdbuf();
  psVar1 = set_streambuf((streambuf *)0x17b209);
  *(streambuf **)(in_RDI + 0x178) = psVar1;
  *(size_t *)(in_RDI + 0x180) = logger::total_warnings;
  *(size_t *)(in_RDI + 0x188) = logger::total_errors;
  return;
}

Assistant:

warning_suppressor()
		: streambuf(set_streambuf(buffer.rdbuf()))
		, warnings(logger::total_warnings)
		, errors(logger::total_errors)
	{ }